

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool __thiscall ghc::filesystem::path::has_extension(path *this)

{
  string local_30 [8];
  long local_28;
  
  extension((path *)local_30,this);
  std::__cxx11::string::~string(local_30);
  return local_28 != 0;
}

Assistant:

GHC_INLINE bool path::has_extension() const
{
    return !extension().empty();
}